

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pybind11.h
# Opt level: O2

object __thiscall pybind11::cpp_function::name(cpp_function *this)

{
  object local_18;
  
  local_18.super_handle.m_ptr = (handle)(PyObject *)0x0;
  detail::accessor::operator_cast_to_object((accessor *)this);
  object::~object(&local_18);
  return (object)(handle)this;
}

Assistant:

object name() const { return attr("__name__"); }